

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TMS320C64xMapping.c
# Opt level: O0

char * TMS320C64x_group_name(csh handle,uint id)

{
  uint i;
  uint id_local;
  csh handle_local;
  char *local_8;
  
  if (id < 0x85) {
    for (i = 0; i < 7; i = i + 1) {
      if (group_name_maps[i].id == id) {
        return group_name_maps[i].name;
      }
    }
    local_8 = group_name_maps[id].name;
  }
  else {
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

const char *TMS320C64x_group_name(csh handle, unsigned int id)
{
#ifndef CAPSTONE_DIET
	unsigned int i;

	if (id >= TMS320C64X_GRP_ENDING)
		return NULL;

	for (i = 0; i < ARR_SIZE(group_name_maps); i++) {
		if (group_name_maps[i].id == id)
			return group_name_maps[i].name;
	}

	return group_name_maps[id].name;
#else
	return NULL;
#endif
}